

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O2

QSslCipher __thiscall
QTlsBackend::createCiphersuite
          (QTlsBackend *this,QString *suiteName,SslProtocol protocol,QString *protocolString)

{
  undefined1 *puVar1;
  undefined8 uVar2;
  bool bVar3;
  long lVar4;
  QLoggingCategory *pQVar5;
  QDebug *pQVar6;
  undefined8 uVar7;
  char *pcVar8;
  QString *this_00;
  long in_FS_OFFSET;
  QLatin1String QVar9;
  QLatin1StringView s;
  QLatin1String QVar10;
  QLatin1StringView s_00;
  QLatin1String QVar11;
  QLatin1StringView s_01;
  QLatin1String QVar12;
  QLatin1StringView s_02;
  QLatin1StringView s_03;
  QLatin1StringView s_04;
  QLatin1StringView s_05;
  QLatin1StringView s_06;
  QLatin1String QVar13;
  QLatin1StringView s_07;
  QLatin1String QVar14;
  qsizetype qStack_80;
  QLatin1StringView local_78;
  undefined4 uStack_68;
  undefined4 local_64;
  char *local_60;
  QLatin1StringView local_58;
  QArrayDataPointer<QStringView> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  QSslCipher::QSslCipher((QSslCipher *)this);
  if ((suiteName->d).size == 0) goto LAB_001c3bc1;
  puVar1 = *(undefined1 **)this;
  *puVar1 = 0;
  QString::operator=((QString *)(puVar1 + 8),(QString *)suiteName);
  lVar4 = *(long *)this;
  *(SslProtocol *)(lVar4 + 0x90) = protocol;
  QString::operator=((QString *)(lVar4 + 0x78),(QString *)protocolString);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d._0_4_ = 0xaaaaaaaa;
  local_48.d._4_4_ = 0xaaaaaaaa;
  local_48.ptr._0_4_ = 0xaaaaaaaa;
  local_48.ptr._4_4_ = 0xaaaaaaaa;
  uVar7 = *(undefined8 *)(*(long *)this + 0x10);
  uVar2 = *(undefined8 *)(*(long *)this + 0x18);
  local_78.m_size._0_4_ = (undefined4)uVar2;
  local_78.m_size._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
  local_78.m_data._0_4_ = (undefined4)uVar7;
  local_78.m_data._4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
  QStringView::split(&local_48,&local_78,0x2d,0,1);
  if ((undefined1 *)0x1 < (ulong)local_48.size) {
    if ((local_48.size & 0x7fffffffffffffeU) == 2) {
      this_00 = (QString *)(*(long *)this + 0x28);
      pcVar8 = "RSA";
      qStack_80 = 3;
LAB_001c38ba:
      QVar9.m_data = pcVar8;
      QVar9.m_size = qStack_80;
      QString::operator=(this_00,QVar9);
    }
    else {
      local_78.m_size._0_4_ = 2;
      local_78.m_size._4_4_ = 0;
      local_78.m_data._0_4_ = 0x248129;
      local_78.m_data._4_4_ = 0;
      bVar3 = comparesEqual(&local_78,(QStringView *)CONCAT44(local_48.ptr._4_4_,local_48.ptr._0_4_)
                           );
      if (bVar3) {
LAB_001c38aa:
        this_00 = (QString *)(*(long *)this + 0x28);
        pcVar8 = "DH";
        qStack_80 = 2;
        goto LAB_001c38ba;
      }
      local_58.m_size = 3;
      local_58.m_data = "DHE";
      bVar3 = comparesEqual(&local_58,(QStringView *)CONCAT44(local_48.ptr._4_4_,local_48.ptr._0_4_)
                           );
      if (bVar3) goto LAB_001c38aa;
      local_78.m_size._0_4_ = 4;
      local_78.m_size._4_4_ = 0;
      local_78.m_data._0_4_ = 0x248127;
      local_78.m_data._4_4_ = 0;
      bVar3 = comparesEqual(&local_78,(QStringView *)CONCAT44(local_48.ptr._4_4_,local_48.ptr._0_4_)
                           );
      if (bVar3) {
LAB_001c3a3b:
        this_00 = (QString *)(*(long *)this + 0x28);
        pcVar8 = "ECDH";
        qStack_80 = 4;
        goto LAB_001c38ba;
      }
      local_58.m_size = 5;
      local_58.m_data = "ECDHE";
      bVar3 = comparesEqual(&local_58,(QStringView *)CONCAT44(local_48.ptr._4_4_,local_48.ptr._0_4_)
                           );
      if (bVar3) goto LAB_001c3a3b;
      pQVar5 = QtPrivateLogging::lcSsl();
      if (((pQVar5->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_60 = pQVar5->name;
        local_78.m_size._0_4_ = 2;
        local_78.m_size._4_4_ = 0;
        local_78.m_data._0_4_ = 0;
        local_78.m_data._4_4_ = 0;
        uStack_68 = 0;
        local_64 = 0;
        QMessageLogger::warning();
        pQVar6 = QDebug::operator<<((QDebug *)&local_58,"Unknown Kx");
        QDebug::operator<<(pQVar6,(QString *)(*(long *)this + 8));
        QDebug::~QDebug((QDebug *)&local_58);
      }
    }
    lVar4 = *(long *)this;
    if ((local_48.size & 0x7fffffffffffffeU) == 2) {
LAB_001c38ce:
      pcVar8 = "RSA";
      qStack_80 = 3;
LAB_001c390b:
      QVar10.m_data = pcVar8;
      QVar10.m_size = qStack_80;
      QString::operator=((QString *)(lVar4 + 0x40),QVar10);
    }
    else {
      s.m_data = "-ECDSA-";
      s.m_size = 7;
      bVar3 = QString::contains((QString *)(lVar4 + 8),s,CaseSensitive);
      lVar4 = *(long *)this;
      if (bVar3) {
        pcVar8 = "ECDSA";
        qStack_80 = 5;
        goto LAB_001c390b;
      }
      s_02.m_data = "-RSA-";
      s_02.m_size = 5;
      bVar3 = QString::contains((QString *)(lVar4 + 8),s_02,CaseSensitive);
      if (bVar3) {
        lVar4 = *(long *)this;
        goto LAB_001c38ce;
      }
      pQVar5 = QtPrivateLogging::lcSsl();
      if (((pQVar5->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_60 = pQVar5->name;
        local_78.m_size._0_4_ = 2;
        local_78.m_size._4_4_ = 0;
        local_78.m_data._0_4_ = 0;
        local_78.m_data._4_4_ = 0;
        uStack_68 = 0;
        local_64 = 0;
        QMessageLogger::warning();
        pQVar6 = QDebug::operator<<((QDebug *)&local_58,"Unknown Au");
        QDebug::operator<<(pQVar6,(QString *)(*(long *)this + 8));
        QDebug::~QDebug((QDebug *)&local_58);
      }
    }
    s_00.m_data = "RC4-";
    s_00.m_size = 4;
    bVar3 = QString::contains((QString *)(*(long *)this + 8),s_00,CaseSensitive);
    lVar4 = *(long *)this;
    if (bVar3) {
      pcVar8 = "RC4(128)";
LAB_001c393c:
      QVar11.m_data = pcVar8;
      QVar11.m_size = 8;
      QString::operator=((QString *)(lVar4 + 0x58),QVar11);
      lVar4 = *(long *)this;
      uVar7 = 0x8000000080;
    }
    else {
      s_01.m_data = "DES-CBC3-";
      s_01.m_size = 9;
      bVar3 = QString::contains((QString *)(lVar4 + 8),s_01,CaseSensitive);
      if (bVar3) {
        QVar12.m_data = "3DES(168)";
        QVar12.m_size = 9;
        QString::operator=((QString *)(*(long *)this + 0x58),QVar12);
        lVar4 = *(long *)this;
        uVar7 = 0xa8000000a8;
      }
      else {
        s_03.m_data = "AES128-";
        s_03.m_size = 7;
        bVar3 = QString::contains((QString *)(*(long *)this + 8),s_03,CaseSensitive);
        lVar4 = *(long *)this;
        if (bVar3) {
          pcVar8 = "AES(128)";
          goto LAB_001c393c;
        }
        s_04.m_data = "AES256-GCM";
        s_04.m_size = 10;
        bVar3 = QString::contains((QString *)(lVar4 + 8),s_04,CaseSensitive);
        lVar4 = *(long *)this;
        if (bVar3) {
          pcVar8 = "AESGCM(256)";
          qStack_80 = 0xb;
        }
        else {
          s_05.m_data = "AES256-";
          s_05.m_size = 7;
          bVar3 = QString::contains((QString *)(lVar4 + 8),s_05,CaseSensitive);
          lVar4 = *(long *)this;
          if (bVar3) {
            pcVar8 = "AES(256)";
          }
          else {
            s_06.m_data = "CHACHA20-";
            s_06.m_size = 9;
            bVar3 = QString::contains((QString *)(lVar4 + 8),s_06,CaseSensitive);
            lVar4 = *(long *)this;
            if (!bVar3) {
              s_07.m_data = "NULL-";
              s_07.m_size = 5;
              bVar3 = QString::contains((QString *)(lVar4 + 8),s_07,CaseSensitive);
              if (bVar3) {
                QVar14.m_data = "NULL";
                QVar14.m_size = 4;
                QString::operator=((QString *)(*(long *)this + 0x58),QVar14);
              }
              else {
                pQVar5 = QtPrivateLogging::lcSsl();
                if (((pQVar5->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
                  local_60 = pQVar5->name;
                  local_78.m_size._0_4_ = 2;
                  local_78.m_size._4_4_ = 0;
                  local_78.m_data._0_4_ = 0;
                  local_78.m_data._4_4_ = 0;
                  uStack_68 = 0;
                  local_64 = 0;
                  QMessageLogger::warning();
                  pQVar6 = QDebug::operator<<((QDebug *)&local_58,"Unknown Enc");
                  QDebug::operator<<(pQVar6,(QString *)(*(long *)this + 8));
                  QDebug::~QDebug((QDebug *)&local_58);
                }
              }
              goto LAB_001c3bb7;
            }
            pcVar8 = "CHACHA20";
          }
          qStack_80 = 8;
        }
        QVar13.m_data = pcVar8;
        QVar13.m_size = qStack_80;
        QString::operator=((QString *)(lVar4 + 0x58),QVar13);
        lVar4 = *(long *)this;
        uVar7 = 0x10000000100;
      }
    }
    *(undefined8 *)(lVar4 + 0x20) = uVar7;
  }
LAB_001c3bb7:
  QArrayDataPointer<QStringView>::~QArrayDataPointer(&local_48);
LAB_001c3bc1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>)
           (unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>)this;
  }
  __stack_chk_fail();
}

Assistant:

QSslCipher QTlsBackend::createCiphersuite(const QString &suiteName, QSsl::SslProtocol protocol,
                                          const QString &protocolString)
{
    QSslCipher ciph;

    if (!suiteName.size())
        return ciph;

    ciph.d->isNull = false;
    ciph.d->name = suiteName;
    ciph.d->protocol = protocol;
    ciph.d->protocolString = protocolString;

    const auto bits = QStringView{ciph.d->name}.split(u'-');
    if (bits.size() >= 2) {
        if (bits.size() == 2 || bits.size() == 3)
            ciph.d->keyExchangeMethod = "RSA"_L1;
        else if (bits.front() == "DH"_L1 || bits.front() == "DHE"_L1)
            ciph.d->keyExchangeMethod = "DH"_L1;
        else if (bits.front() == "ECDH"_L1 || bits.front() == "ECDHE"_L1)
            ciph.d->keyExchangeMethod = "ECDH"_L1;
        else
            qCWarning(lcSsl) << "Unknown Kx" << ciph.d->name;

        if (bits.size() == 2 || bits.size() == 3)
            ciph.d->authenticationMethod = "RSA"_L1;
        else if (ciph.d->name.contains("-ECDSA-"_L1))
            ciph.d->authenticationMethod = "ECDSA"_L1;
        else if (ciph.d->name.contains("-RSA-"_L1))
            ciph.d->authenticationMethod = "RSA"_L1;
        else
            qCWarning(lcSsl) << "Unknown Au" << ciph.d->name;

        if (ciph.d->name.contains("RC4-"_L1)) {
            ciph.d->encryptionMethod = "RC4(128)"_L1;
            ciph.d->bits = 128;
            ciph.d->supportedBits = 128;
        } else if (ciph.d->name.contains("DES-CBC3-"_L1)) {
            ciph.d->encryptionMethod = "3DES(168)"_L1;
            ciph.d->bits = 168;
            ciph.d->supportedBits = 168;
        } else if (ciph.d->name.contains("AES128-"_L1)) {
            ciph.d->encryptionMethod = "AES(128)"_L1;
            ciph.d->bits = 128;
            ciph.d->supportedBits = 128;
        } else if (ciph.d->name.contains("AES256-GCM"_L1)) {
            ciph.d->encryptionMethod = "AESGCM(256)"_L1;
            ciph.d->bits = 256;
            ciph.d->supportedBits = 256;
        } else if (ciph.d->name.contains("AES256-"_L1)) {
            ciph.d->encryptionMethod = "AES(256)"_L1;
            ciph.d->bits = 256;
            ciph.d->supportedBits = 256;
        } else if (ciph.d->name.contains("CHACHA20-"_L1)) {
            ciph.d->encryptionMethod = "CHACHA20"_L1;
            ciph.d->bits = 256;
            ciph.d->supportedBits = 256;
        } else if (ciph.d->name.contains("NULL-"_L1)) {
            ciph.d->encryptionMethod = "NULL"_L1;
        } else {
            qCWarning(lcSsl) << "Unknown Enc" << ciph.d->name;
        }
    }
    return ciph;
}